

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O0

int WebPRescalerGetScaledDimensions
              (int src_width,int src_height,int *scaled_width,int *scaled_height)

{
  int max_size;
  int height;
  int width;
  int *scaled_height_local;
  int *scaled_width_local;
  int src_height_local;
  int src_width_local;
  undefined4 local_4;
  
  width = *scaled_width;
  height = *scaled_height;
  if ((width == 0) && (0 < src_height)) {
    width = (int)((((long)src_width * (long)height + (long)src_height) - 1U) /
                 (ulong)(long)src_height);
  }
  if ((height == 0) && (0 < src_width)) {
    height = (int)((((long)src_height * (long)width + (long)src_width) - 1U) /
                  (ulong)(long)src_width);
  }
  if ((((width < 1) || (height < 1)) || (0x3fffffff < width)) || (0x3fffffff < height)) {
    local_4 = 0;
  }
  else {
    *scaled_width = width;
    *scaled_height = height;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPRescalerGetScaledDimensions(int src_width, int src_height,
                                    int* const scaled_width,
                                    int* const scaled_height) {
  assert(scaled_width != NULL);
  assert(scaled_height != NULL);
  {
    int width = *scaled_width;
    int height = *scaled_height;
    const int max_size = INT_MAX / 2;

    // if width is unspecified, scale original proportionally to height ratio.
    if (width == 0 && src_height > 0) {
      width =
          (int)(((uint64_t)src_width * height + src_height - 1) / src_height);
    }
    // if height is unspecified, scale original proportionally to width ratio.
    if (height == 0 && src_width > 0) {
      height =
          (int)(((uint64_t)src_height * width + src_width - 1) / src_width);
    }
    // Check if the overall dimensions still make sense.
    if (width <= 0 || height <= 0 || width > max_size || height > max_size) {
      return 0;
    }

    *scaled_width = width;
    *scaled_height = height;
    return 1;
  }
}